

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall FxPostIncrDecr::FxPostIncrDecr(FxPostIncrDecr *this,FxExpression *base,int token)

{
  int token_local;
  FxExpression *base_local;
  FxPostIncrDecr *this_local;
  
  FxExpression::FxExpression(&this->super_FxExpression,EFX_PostIncrDecr,&base->ScriptPosition);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxPostIncrDecr_00a0a170;
  this->Token = token;
  this->Base = base;
  return;
}

Assistant:

FxPostIncrDecr::FxPostIncrDecr(FxExpression *base, int token)
: FxExpression(EFX_PostIncrDecr, base->ScriptPosition), Token(token), Base(base)
{
}